

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QSslEllipticCurve>::emplace<QSslEllipticCurve_const&>
          (QPodArrayOps<QSslEllipticCurve> *this,qsizetype i,QSslEllipticCurve *args)

{
  qsizetype *pqVar1;
  int iVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  QSslEllipticCurve *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QSslEllipticCurve>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QSslEllipticCurve>).size == i) &&
       (qVar5 = QArrayDataPointer<QSslEllipticCurve>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QSslEllipticCurve>), qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QSslEllipticCurve>).size;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr[lVar4].id = args->id;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<QSslEllipticCurve>::freeSpaceAtBegin
                          (&this->super_QArrayDataPointer<QSslEllipticCurve>), qVar5 != 0)) {
      pQVar6 = (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr;
      pQVar6[-1].id = args->id;
      (this->super_QArrayDataPointer<QSslEllipticCurve>).ptr = pQVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QSslEllipticCurve>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  iVar2 = args->id;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QSslEllipticCurve>).size != 0);
  QArrayDataPointer<QSslEllipticCurve>::detachAndGrow
            (&this->super_QArrayDataPointer<QSslEllipticCurve>,where,1,(QSslEllipticCurve **)0x0,
             (QArrayDataPointer<QSslEllipticCurve> *)0x0);
  pQVar6 = createHole(this,where,i,1);
  pQVar6->id = iVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }